

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters_sse42_intr.c
# Opt level: O2

void ihevc_intra_pred_luma_ver_sse42
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  ulong *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  WORD32 WVar17;
  int iVar18;
  long lVar19;
  UWORD8 *pUVar20;
  ulong uVar21;
  long lVar22;
  bool bVar23;
  
  lVar19 = (long)nt;
  uVar9 = lVar19 * 2;
  lVar22 = (long)dst_strd;
  if (nt == 0x20) {
    uVar13 = *(undefined8 *)(pu1_ref + (uVar9 & 0xffffffff) + 1);
    uVar14 = *(undefined8 *)(pu1_ref + (uVar9 & 0xffffffff) + 1 + 8);
    uVar15 = *(undefined8 *)(pu1_ref + (uVar9 & 0xffffffff) + 0x11);
    uVar16 = *(undefined8 *)(pu1_ref + (uVar9 & 0xffffffff) + 0x11 + 8);
    iVar18 = 2;
    while (bVar23 = iVar18 != 0, iVar18 = iVar18 + -1, bVar23) {
      *(undefined8 *)pu1_dst = uVar13;
      *(undefined8 *)(pu1_dst + 8) = uVar14;
      *(undefined8 *)(pu1_dst + lVar22) = uVar13;
      *(undefined8 *)(pu1_dst + lVar22 + 8) = uVar14;
      *(undefined8 *)(pu1_dst + dst_strd * 2) = uVar13;
      *(undefined8 *)(pu1_dst + dst_strd * 2 + 8) = uVar14;
      *(undefined8 *)(pu1_dst + dst_strd * 3) = uVar13;
      *(undefined8 *)(pu1_dst + dst_strd * 3 + 8) = uVar14;
      *(undefined8 *)(pu1_dst + dst_strd * 4) = uVar13;
      *(undefined8 *)(pu1_dst + dst_strd * 4 + 8) = uVar14;
      *(undefined8 *)(pu1_dst + dst_strd * 5) = uVar13;
      *(undefined8 *)(pu1_dst + dst_strd * 5 + 8) = uVar14;
      *(undefined8 *)(pu1_dst + dst_strd * 6) = uVar13;
      *(undefined8 *)(pu1_dst + dst_strd * 6 + 8) = uVar14;
      *(undefined8 *)(pu1_dst + dst_strd * 7) = uVar13;
      *(undefined8 *)(pu1_dst + dst_strd * 7 + 8) = uVar14;
      *(undefined8 *)(pu1_dst + 0x10) = uVar15;
      *(undefined8 *)(pu1_dst + 0x18) = uVar16;
      *(undefined8 *)(pu1_dst + lVar22 + 0x10) = uVar15;
      *(undefined8 *)(pu1_dst + lVar22 + 0x10 + 8) = uVar16;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 2) + 0x10) = uVar15;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 2) + 0x10 + 8) = uVar16;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 3) + 0x10) = uVar15;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 3) + 0x10 + 8) = uVar16;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 4) + 0x10) = uVar15;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 4) + 0x10 + 8) = uVar16;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 5) + 0x10) = uVar15;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 5) + 0x10 + 8) = uVar16;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 6) + 0x10) = uVar15;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 6) + 0x10 + 8) = uVar16;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 7) + 0x10) = uVar15;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 7) + 0x10 + 8) = uVar16;
      *(undefined8 *)(pu1_dst + dst_strd * 8) = uVar13;
      *(undefined8 *)(pu1_dst + dst_strd * 8 + 8) = uVar14;
      *(undefined8 *)(pu1_dst + dst_strd * 9) = uVar13;
      *(undefined8 *)(pu1_dst + dst_strd * 9 + 8) = uVar14;
      *(undefined8 *)(pu1_dst + dst_strd * 10) = uVar13;
      *(undefined8 *)(pu1_dst + dst_strd * 10 + 8) = uVar14;
      *(undefined8 *)(pu1_dst + dst_strd * 0xb) = uVar13;
      *(undefined8 *)(pu1_dst + dst_strd * 0xb + 8) = uVar14;
      *(undefined8 *)(pu1_dst + dst_strd * 0xc) = uVar13;
      *(undefined8 *)(pu1_dst + dst_strd * 0xc + 8) = uVar14;
      *(undefined8 *)(pu1_dst + dst_strd * 0xd) = uVar13;
      *(undefined8 *)(pu1_dst + dst_strd * 0xd + 8) = uVar14;
      *(undefined8 *)(pu1_dst + dst_strd * 0xe) = uVar13;
      *(undefined8 *)(pu1_dst + dst_strd * 0xe + 8) = uVar14;
      *(undefined8 *)(pu1_dst + dst_strd * 0xf) = uVar13;
      *(undefined8 *)(pu1_dst + dst_strd * 0xf + 8) = uVar14;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 8) + 0x10) = uVar15;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 8) + 0x10 + 8) = uVar16;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 9) + 0x10) = uVar15;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 9) + 0x10 + 8) = uVar16;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 10) + 0x10) = uVar15;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 10) + 0x10 + 8) = uVar16;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 0xb) + 0x10) = uVar15;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 0xb) + 0x10 + 8) = uVar16;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 0xc) + 0x10) = uVar15;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 0xc) + 0x10 + 8) = uVar16;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 0xd) + 0x10) = uVar15;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 0xd) + 0x10 + 8) = uVar16;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 0xe) + 0x10) = uVar15;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 0xe) + 0x10 + 8) = uVar16;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 0xf) + 0x10) = uVar15;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 0xf) + 0x10 + 8) = uVar16;
      pu1_dst = pu1_dst + (dst_strd << 4);
    }
  }
  else {
    pUVar20 = pu1_dst + (lVar19 + -1) * lVar22;
    WVar17 = nt;
    for (; 0 < lVar19; lVar19 = lVar19 + -1) {
      iVar18 = ((int)((uint)pu1_ref[WVar17] - (uint)pu1_ref[uVar9]) >> 1) +
               (uint)pu1_ref[(long)(int)uVar9 | 1];
      if ((short)iVar18 < 1) {
        iVar18 = 0;
      }
      if (0xfe < (short)iVar18) {
        iVar18 = 0xff;
      }
      *pUVar20 = (UWORD8)iVar18;
      WVar17 = WVar17 + 1;
      pUVar20 = pUVar20 + -lVar22;
    }
    if (nt == 4) {
      uVar12 = *(uint *)(pu1_ref + (uVar9 & 0xffffffff) + 1);
      bVar2 = pu1_dst[lVar22];
      bVar3 = pu1_dst[lVar22 * 2];
      bVar4 = pu1_dst[lVar22 * 3];
      *(uint *)pu1_dst = uVar12 & 0xffffff00 | (uint)*pu1_dst;
      *(uint *)(pu1_dst + lVar22) = uVar12 & 0xffffff00 | (uint)bVar2;
      *(uint *)(pu1_dst + lVar22 * 2) = uVar12 & 0xffffff00 | (uint)bVar3;
      *(uint *)(pu1_dst + lVar22 * 3) = uVar12 & 0xffffff00 | (uint)bVar4;
    }
    else if (nt == 8) {
      uVar9 = *(ulong *)(pu1_ref + (uVar9 & 0xffffffff) + 1);
      bVar2 = pu1_dst[lVar22];
      bVar3 = pu1_dst[lVar22 * 2];
      bVar4 = pu1_dst[lVar22 * 3];
      bVar5 = pu1_dst[lVar22 * 4];
      bVar6 = pu1_dst[lVar22 * 5];
      bVar7 = pu1_dst[lVar22 * 6];
      bVar8 = pu1_dst[lVar22 * 7];
      *(ulong *)pu1_dst = uVar9 & 0xffffffffffffff00 | (ulong)*pu1_dst;
      *(ulong *)(pu1_dst + lVar22) = uVar9 & 0xffffffffffffff00 | (ulong)bVar2;
      *(ulong *)(pu1_dst + lVar22 * 2) = uVar9 & 0xffffffffffffff00 | (ulong)bVar3;
      *(ulong *)(pu1_dst + lVar22 * 3) = uVar9 & 0xffffffffffffff00 | (ulong)bVar4;
      *(ulong *)(pu1_dst + lVar22 * 4) = uVar9 & 0xffffffffffffff00 | (ulong)bVar5;
      *(ulong *)(pu1_dst + lVar22 * 5) = uVar9 & 0xffffffffffffff00 | (ulong)bVar6;
      *(ulong *)(pu1_dst + lVar22 * 6) = uVar9 & 0xffffffffffffff00 | (ulong)bVar7;
      *(ulong *)(pu1_dst + lVar22 * 7) = uVar9 & 0xffffffffffffff00 | (ulong)bVar8;
    }
    else if (nt == 0x10) {
      for (uVar21 = 0; uVar21 < 0x10; uVar21 = uVar21 + 8) {
        uVar10 = *(ulong *)(pu1_ref + (uVar9 & 0xffffffff) + 1);
        uVar11 = *(ulong *)((long)(pu1_ref + (uVar9 & 0xffffffff) + 1) + 8);
        bVar2 = *(byte *)((long)pu1_dst + lVar22);
        bVar3 = *(byte *)((long)pu1_dst + lVar22 * 2);
        bVar4 = *(byte *)((long)pu1_dst + lVar22 * 3);
        bVar5 = *(byte *)((long)pu1_dst + lVar22 * 4);
        bVar6 = *(byte *)((long)pu1_dst + lVar22 * 5);
        bVar7 = *(byte *)((long)pu1_dst + lVar22 * 6);
        bVar8 = *(byte *)((long)pu1_dst + lVar22 * 7);
        *(ulong *)pu1_dst = uVar10 & 0xffffffffffffff00 | (ulong)(byte)*(ulong *)pu1_dst;
        *(ulong *)((long)pu1_dst + 8) = uVar11;
        *(ulong *)((long)pu1_dst + lVar22) = uVar10 & 0xffffffffffffff00 | (ulong)bVar2;
        ((ulong *)((long)pu1_dst + lVar22))[1] = uVar11;
        puVar1 = (ulong *)((long)pu1_dst + lVar22 * 2);
        *puVar1 = uVar10 & 0xffffffffffffff00 | (ulong)bVar3;
        puVar1[1] = uVar11;
        puVar1 = (ulong *)((long)pu1_dst + lVar22 * 3);
        *puVar1 = uVar10 & 0xffffffffffffff00 | (ulong)bVar4;
        puVar1[1] = uVar11;
        puVar1 = (ulong *)((long)pu1_dst + lVar22 * 4);
        *puVar1 = uVar10 & 0xffffffffffffff00 | (ulong)bVar5;
        puVar1[1] = uVar11;
        puVar1 = (ulong *)((long)pu1_dst + lVar22 * 5);
        *puVar1 = uVar10 & 0xffffffffffffff00 | (ulong)bVar6;
        puVar1[1] = uVar11;
        puVar1 = (ulong *)((long)pu1_dst + lVar22 * 6);
        *puVar1 = uVar10 & 0xffffffffffffff00 | (ulong)bVar7;
        puVar1[1] = uVar11;
        puVar1 = (ulong *)((long)pu1_dst + lVar22 * 7);
        *puVar1 = uVar10 & 0xffffffffffffff00 | (ulong)bVar8;
        puVar1[1] = uVar11;
        pu1_dst = (UWORD8 *)((long)pu1_dst + lVar22 * 8);
      }
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_ver_sse42(UWORD8 *pu1_ref,
                                     WORD32 src_strd,
                                     UWORD8 *pu1_dst,
                                     WORD32 dst_strd,
                                     WORD32 nt,
                                     WORD32 mode)
{
    WORD32 row;
    WORD16 s2_predpixel;
    WORD32 two_nt = 2 * nt;
    __m128i src_temp0, src_temp1, src_temp2, src_temp3, src_temp4, src_temp5, src_temp6, src_temp7;

    UNUSED(src_strd);
    UNUSED(mode);

    if(nt == 32)
    {
        __m128i temp1, temp2;
        WORD32 itr_count;

        temp1 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));
        temp2 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1 + 16));

        for(itr_count = 0; itr_count < 2; itr_count++)
        {
            /*  pu1_dst[(row * dst_strd) + col] = dc_val;*/
            _mm_storeu_si128((__m128i *)(pu1_dst + ((0) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((1) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((2) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((3) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((4) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((5) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((6) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((7) * dst_strd)), temp1);

            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((0) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((1) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((2) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((3) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((4) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((5) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((6) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((7) * dst_strd)), temp2);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((8) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((9) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((10) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((11) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((12) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((13) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((14) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((15) * dst_strd)), temp1);

            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((8) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((9) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((10) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((11) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((12) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((13) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((14) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((15) * dst_strd)), temp2);

            pu1_dst += 16 * dst_strd;
        }
    }

    else

    {
        /*Filtering done for the 1st column */
        for(row = nt - 1; row >= 0; row--)
        {
            s2_predpixel = pu1_ref[two_nt + 1]
                            + ((pu1_ref[two_nt - 1 - row] - pu1_ref[two_nt]) >> 1);
            pu1_dst[row * dst_strd] = CLIP_U8(s2_predpixel);
        }

        /* Replication to next columns*/

        if(nt == 4)
        {
            int temp1, temp2, temp3, temp4;

            src_temp2 =   _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));
            src_temp3 =  src_temp2;
            src_temp4 =  src_temp2;
            src_temp5 =  src_temp2;

            src_temp2 = _mm_insert_epi8(src_temp2, pu1_dst[(0 * dst_strd)], 0);
            src_temp3 = _mm_insert_epi8(src_temp3, pu1_dst[(1 * dst_strd)], 0);
            src_temp4 = _mm_insert_epi8(src_temp4, pu1_dst[(2 * dst_strd)], 0);
            src_temp5 = _mm_insert_epi8(src_temp5, pu1_dst[(3 * dst_strd)], 0);

            temp1 = _mm_cvtsi128_si32(src_temp2);
            temp2 = _mm_cvtsi128_si32(src_temp3);
            temp3 = _mm_cvtsi128_si32(src_temp4);
            temp4 = _mm_cvtsi128_si32(src_temp5);

            /* loding 4-bit 8 pixels values */
            *(WORD32 *)(&pu1_dst[(0 * dst_strd)]) = temp1;
            *(WORD32 *)(&pu1_dst[(1 * dst_strd)]) = temp2;
            *(WORD32 *)(&pu1_dst[(2 * dst_strd)]) = temp3;
            *(WORD32 *)(&pu1_dst[(3 * dst_strd)]) = temp4;

        }
        else if(nt == 8)
        {

            src_temp0 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));
            src_temp1 = src_temp0;
            src_temp2 = src_temp0;
            src_temp3 = src_temp0;
            src_temp4 = src_temp0;
            src_temp5 = src_temp0;
            src_temp6 = src_temp0;
            src_temp7 = src_temp0;

            src_temp0 = _mm_insert_epi8(src_temp0, pu1_dst[((0) * dst_strd)], 0);
            src_temp1 = _mm_insert_epi8(src_temp1, pu1_dst[((1) * dst_strd)], 0);
            src_temp2 = _mm_insert_epi8(src_temp2, pu1_dst[((2) * dst_strd)], 0);
            src_temp3 = _mm_insert_epi8(src_temp3, pu1_dst[((3) * dst_strd)], 0);
            src_temp4 = _mm_insert_epi8(src_temp4, pu1_dst[((4) * dst_strd)], 0);
            src_temp5 = _mm_insert_epi8(src_temp5, pu1_dst[((5) * dst_strd)], 0);
            src_temp6 = _mm_insert_epi8(src_temp6, pu1_dst[((6) * dst_strd)], 0);
            src_temp7 = _mm_insert_epi8(src_temp7, pu1_dst[((7) * dst_strd)], 0);

            _mm_storel_epi64((__m128i *)(pu1_dst + ((0) * dst_strd)), src_temp0);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((1) * dst_strd)), src_temp1);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((2) * dst_strd)), src_temp2);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((3) * dst_strd)), src_temp3);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((4) * dst_strd)), src_temp4);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((5) * dst_strd)), src_temp5);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((6) * dst_strd)), src_temp6);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((7) * dst_strd)), src_temp7);


        }
        else if(nt == 16)
        {
            for(row = 0; row < nt; row += 8)
            {

                src_temp0 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));
                src_temp1 = src_temp0;
                src_temp2 = src_temp0;
                src_temp3 = src_temp0;
                src_temp4 = src_temp0;
                src_temp5 = src_temp0;
                src_temp6 = src_temp0;
                src_temp7 = src_temp0;

                src_temp0 = _mm_insert_epi8(src_temp0, pu1_dst[((row + 0) * dst_strd)], 0);
                src_temp1 = _mm_insert_epi8(src_temp1, pu1_dst[((row + 1) * dst_strd)], 0);
                src_temp2 = _mm_insert_epi8(src_temp2, pu1_dst[((row + 2) * dst_strd)], 0);
                src_temp3 = _mm_insert_epi8(src_temp3, pu1_dst[((row + 3) * dst_strd)], 0);
                src_temp4 = _mm_insert_epi8(src_temp4, pu1_dst[((row + 4) * dst_strd)], 0);
                src_temp5 = _mm_insert_epi8(src_temp5, pu1_dst[((row + 5) * dst_strd)], 0);
                src_temp6 = _mm_insert_epi8(src_temp6, pu1_dst[((row + 6) * dst_strd)], 0);
                src_temp7 = _mm_insert_epi8(src_temp7, pu1_dst[((row + 7) * dst_strd)], 0);

                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 0) * dst_strd)), src_temp0);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 1) * dst_strd)), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 2) * dst_strd)), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 3) * dst_strd)), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 4) * dst_strd)), src_temp4);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 5) * dst_strd)), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 6) * dst_strd)), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 7) * dst_strd)), src_temp7);

            }

        }


    }
}